

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_fsm.cpp
# Opt level: O0

void __thiscall
afsm::test::TranFSM_StaticHandledEvents_Test::~TranFSM_StaticHandledEvents_Test
          (TranFSM_StaticHandledEvents_Test *this)

{
  TranFSM_StaticHandledEvents_Test *this_local;
  
  ~TranFSM_StaticHandledEvents_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TranFSM, StaticHandledEvents)
{
    connection_fsm fsm;

    EXPECT_TRUE(
        fsm.static_handled_events().count( &detail::event<events::connect>::id ))
            << "Immediately handled event";
    EXPECT_TRUE(
        fsm.static_handled_events().count( &detail::event<events::terminate>::id ))
            << "Immediately handled event";
    EXPECT_TRUE(
        fsm.static_handled_events().count( &detail::event<events::complete>::id ))
            << "Immediately handled event";
    EXPECT_TRUE(
        fsm.static_handled_events().count( &detail::event<events::conn_error>::id ))
            << "Immediately handled event";
    EXPECT_TRUE(
        fsm.static_handled_events().count( &detail::event<events::ready_for_query>::id ))
            << "Immediately handled event";
    EXPECT_TRUE(
        fsm.static_handled_events().count( &detail::event<events::begin>::id ))
            << "Immediately handled event";


    EXPECT_FALSE(
        fsm.static_handled_events().count( &detail::event<events::commit>::id ))
            << "Event handled by a nested state";
    EXPECT_FALSE(
        fsm.static_handled_events().count( &detail::event<events::row_event>::id ))
            << "Event handled by a nested state";
    EXPECT_FALSE(
        fsm.static_handled_events().count( &detail::event<events::command_complete>::id ))
            << "Event handled by a nested state";
}